

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O2

string * __thiscall
google::protobuf::FieldDescriptor::DebugStringWithOptions_abi_cxx11_
          (string *__return_storage_ptr__,FieldDescriptor *this,
          DebugStringOptions *debug_string_options)

{
  bool bVar1;
  string_view format;
  Arg local_48;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  bVar1 = (this->field_0x1 & 8) != 0;
  if (bVar1) {
    local_48.piece_._M_str = (this->containing_type_->all_names_).payload_;
    local_48.piece_._M_len = (size_t)*(ushort *)(local_48.piece_._M_str + 2);
    local_48.piece_._M_str = local_48.piece_._M_str + ~local_48.piece_._M_len;
    format._M_str = "extend .$0 {\n";
    format._M_len = 0xd;
    absl::lts_20250127::SubstituteAndAppend(__return_storage_ptr__,format,&local_48);
  }
  DebugString(this,(uint)bVar1,__return_storage_ptr__,debug_string_options);
  if ((this->field_0x1 & 8) != 0) {
    std::__cxx11::string::append((char *)__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string FieldDescriptor::DebugStringWithOptions(
    const DebugStringOptions& debug_string_options) const {
  std::string contents;
  int depth = 0;
  if (is_extension()) {
    absl::SubstituteAndAppend(&contents, "extend .$0 {\n",
                              containing_type()->full_name());
    depth = 1;
  }
  DebugString(depth, &contents, debug_string_options);
  if (is_extension()) {
    contents.append("}\n");
  }
  return contents;
}